

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_bool>
pdqsort_detail::
partition_right_branchless<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>>
          (double *begin,double *end,double *param_3)

{
  double *pdVar1;
  byte *pbVar2;
  byte *pbVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  byte bVar7;
  char cVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  double *pdVar14;
  double *pdVar15;
  byte *pbVar16;
  ulong uVar17;
  double *pdVar18;
  undefined1 *puVar19;
  double *pdVar20;
  double *pdVar21;
  byte *pbVar22;
  double *pdVar23;
  long lVar24;
  ulong uVar25;
  double __tmp;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_bool>
  pVar26;
  uchar offsets_l_storage [128];
  byte local_101 [128];
  byte abStack_81 [81];
  
  dVar4 = *begin;
  lVar9 = 0;
  do {
    dVar5 = *(double *)((long)begin + lVar9 + 8);
    lVar9 = lVar9 + 8;
  } while (dVar5 < dVar4);
  pdVar1 = (double *)((long)begin + lVar9);
  pdVar18 = end;
  if (lVar9 == 8) {
    do {
      if (end <= pdVar1) break;
      pdVar18 = end + -1;
      pdVar14 = end + -1;
      end = pdVar18;
    } while (dVar4 < *pdVar14 || dVar4 == *pdVar14);
  }
  else {
    do {
      end = pdVar18 + -1;
      pdVar14 = pdVar18 + -1;
      pdVar18 = end;
    } while (dVar4 < *pdVar14 || dVar4 == *pdVar14);
  }
  pdVar18 = pdVar1;
  if (pdVar1 < end) {
    pdVar18 = (double *)((long)begin + lVar9) + 1;
    *(double *)((long)begin + lVar9) = *end;
    *end = dVar5;
    if (pdVar18 < end) {
      pbVar16 = abStack_81 + 1;
      pbVar22 = local_101 + 1;
      lVar24 = 0;
      pdVar23 = (double *)0x0;
      pdVar10 = (double *)0x0;
      lVar9 = 0;
      pdVar20 = end;
      pdVar21 = pdVar18;
      pdVar14 = end;
      do {
        uVar17 = (long)pdVar14 - (long)pdVar21 >> 3;
        uVar12 = uVar17 >> (pdVar23 == (double *)0x0);
        if (pdVar10 != (double *)0x0) {
          uVar12 = 0;
        }
        uVar17 = uVar17 - uVar12;
        if (pdVar23 != (double *)0x0) {
          uVar17 = 0;
        }
        if (uVar12 < 0x40) {
          pdVar11 = pdVar10;
          if (uVar12 != 0) {
            lVar13 = 0;
            uVar25 = 0;
            do {
              pbVar16[(long)pdVar10] = (byte)uVar25;
              pdVar11 = pdVar21 + uVar25;
              uVar25 = uVar25 + 1;
              pdVar10 = (double *)((ulong)(dVar4 < *pdVar11 || dVar4 == *pdVar11) + (long)pdVar10);
              lVar13 = lVar13 + -8;
            } while (uVar12 != uVar25);
            pdVar21 = (double *)((long)pdVar21 - lVar13);
            pdVar11 = pdVar10;
          }
        }
        else {
          lVar13 = 0;
          uVar12 = 0xfffffffffffffff8;
          do {
            uVar25 = uVar12 + 8;
            pbVar16[(long)pdVar10] = (byte)uVar25;
            puVar19 = (undefined1 *)
                      ((ulong)(dVar4 < pdVar21[uVar12 + 8] || dVar4 == pdVar21[uVar12 + 8]) +
                      (long)pdVar10);
            cVar8 = (char)uVar12;
            pbVar16[(long)puVar19] = cVar8 + 9;
            puVar19 = puVar19 + (dVar4 < pdVar21[uVar12 + 9] || dVar4 == pdVar21[uVar12 + 9]);
            pbVar16[(long)puVar19] = cVar8 + 10;
            puVar19 = puVar19 + (dVar4 < pdVar21[uVar12 + 10] || dVar4 == pdVar21[uVar12 + 10]);
            pbVar16[(long)puVar19] = cVar8 + 0xb;
            puVar19 = puVar19 + (dVar4 < pdVar21[uVar12 + 0xb] || dVar4 == pdVar21[uVar12 + 0xb]);
            pbVar16[(long)puVar19] = cVar8 + 0xc;
            puVar19 = puVar19 + (dVar4 < pdVar21[uVar12 + 0xc] || dVar4 == pdVar21[uVar12 + 0xc]);
            pbVar16[(long)puVar19] = cVar8 + 0xd;
            puVar19 = puVar19 + (dVar4 < pdVar21[uVar12 + 0xd] || dVar4 == pdVar21[uVar12 + 0xd]);
            pbVar16[(long)puVar19] = cVar8 + 0xe;
            dVar5 = pdVar21[uVar12 + 0xe];
            dVar6 = pdVar21[uVar12 + 0xe];
            pbVar16[(long)(puVar19 + (dVar4 < dVar6 || dVar4 == dVar5))] = cVar8 + 0xf;
            pdVar10 = (double *)
                      (puVar19 + (dVar4 < dVar6 || dVar4 == dVar5) +
                      (dVar4 < pdVar21[uVar12 + 0xf] || dVar4 == pdVar21[uVar12 + 0xf]));
            lVar13 = lVar13 + 0x40;
            uVar12 = uVar25;
          } while (uVar25 < 0x38);
          pdVar21 = (double *)((long)pdVar21 + lVar13);
          pdVar11 = pdVar10;
        }
        if (uVar17 < 0x40) {
          if (uVar17 != 0) {
            uVar12 = 0;
            do {
              uVar12 = uVar12 + 1;
              pbVar22[(long)pdVar23] = (byte)uVar12;
              pdVar10 = pdVar14 + -1;
              pdVar14 = pdVar14 + -1;
              pdVar23 = (double *)((long)pdVar23 + (ulong)(*pdVar10 <= dVar4 && dVar4 != *pdVar10));
            } while (uVar17 != uVar12);
          }
        }
        else {
          uVar12 = 0xfffffffffffffff8;
          do {
            cVar8 = (char)uVar12;
            pbVar22[(long)pdVar23] = cVar8 + 9;
            puVar19 = (undefined1 *)
                      ((ulong)(pdVar14[-1] <= dVar4 && dVar4 != pdVar14[-1]) + (long)pdVar23);
            pbVar22[(long)puVar19] = cVar8 + 10;
            puVar19 = puVar19 + (pdVar14[-2] <= dVar4 && dVar4 != pdVar14[-2]);
            pbVar22[(long)puVar19] = cVar8 + 0xb;
            puVar19 = puVar19 + (pdVar14[-3] <= dVar4 && dVar4 != pdVar14[-3]);
            pbVar22[(long)puVar19] = cVar8 + 0xc;
            puVar19 = puVar19 + (pdVar14[-4] <= dVar4 && dVar4 != pdVar14[-4]);
            pbVar22[(long)puVar19] = cVar8 + 0xd;
            puVar19 = puVar19 + (pdVar14[-5] <= dVar4 && dVar4 != pdVar14[-5]);
            pbVar22[(long)puVar19] = cVar8 + 0xe;
            puVar19 = puVar19 + (pdVar14[-6] <= dVar4 && dVar4 != pdVar14[-6]);
            pbVar22[(long)puVar19] = cVar8 + 0xf;
            dVar5 = pdVar14[-7];
            dVar6 = pdVar14[-7];
            pbVar22[(long)(puVar19 + (dVar6 <= dVar4 && dVar4 != dVar5))] = cVar8 + 0x10;
            pdVar10 = pdVar14 + -8;
            pdVar14 = pdVar14 + -8;
            pdVar23 = (double *)
                      (puVar19 + (dVar6 <= dVar4 && dVar4 != dVar5) +
                      (*pdVar10 <= dVar4 && dVar4 != *pdVar10));
            uVar12 = uVar12 + 8;
          } while (uVar12 < 0x38);
        }
        param_3 = pdVar11;
        if (pdVar23 < pdVar11) {
          param_3 = pdVar23;
        }
        pbVar2 = pbVar16 + lVar24;
        pbVar3 = pbVar22 + lVar9;
        if (pdVar11 == pdVar23) {
          if (param_3 != (double *)0x0) {
            pdVar10 = (double *)0x0;
            do {
              bVar7 = pbVar3[(long)pdVar10];
              dVar5 = pdVar18[pbVar2[(long)pdVar10]];
              pdVar18[pbVar2[(long)pdVar10]] = pdVar20[-(ulong)bVar7];
              pdVar20[-(ulong)bVar7] = dVar5;
              pdVar10 = (double *)((long)pdVar10 + 1);
            } while (param_3 != pdVar10);
          }
        }
        else if (param_3 != (double *)0x0) {
          pdVar10 = pdVar20 + -(ulong)*pbVar3;
          dVar5 = pdVar18[*pbVar2];
          pdVar18[*pbVar2] = *pdVar10;
          if (param_3 != (double *)&DAT_00000001) {
            pdVar15 = (double *)&DAT_00000001;
            do {
              bVar7 = pbVar2[(long)pdVar15];
              *pdVar10 = pdVar18[bVar7];
              pdVar10 = pdVar20 + -(ulong)pbVar3[(long)pdVar15];
              pdVar18[bVar7] = *pdVar10;
              pdVar15 = (double *)((long)pdVar15 + 1);
            } while (param_3 != pdVar15);
          }
          *pdVar10 = dVar5;
        }
        pdVar10 = (double *)((long)pdVar11 - (long)param_3);
        lVar24 = lVar24 + (long)param_3;
        lVar9 = lVar9 + (long)param_3;
        if (pdVar11 <= pdVar23) {
          lVar24 = 0;
          pdVar18 = pdVar21;
        }
        pdVar23 = (double *)((long)pdVar23 - (long)param_3);
        if (pdVar23 == (double *)0x0) {
          lVar9 = 0;
          pdVar20 = pdVar14;
        }
      } while (pdVar21 < pdVar14);
      if (pdVar10 != (double *)0x0) {
        do {
          param_3 = (double *)(ulong)(abStack_81 + lVar24)[(long)pdVar10];
          dVar5 = pdVar18[(long)param_3];
          pdVar18[(long)param_3] = pdVar14[-1];
          pdVar14[-1] = dVar5;
          pdVar10 = (double *)((long)pdVar10 + -1);
          pdVar21 = pdVar14 + -1;
          pdVar14 = pdVar14 + -1;
        } while (pdVar10 != (double *)0x0);
      }
      pdVar18 = pdVar21;
      if (pdVar23 != (double *)0x0) {
        pdVar14 = pdVar18;
        do {
          param_3 = pdVar20 + -(ulong)(local_101 + lVar9)[(long)pdVar23];
          pdVar18 = pdVar14 + 1;
          dVar5 = *param_3;
          *param_3 = *pdVar14;
          *pdVar14 = dVar5;
          pdVar23 = (double *)((long)pdVar23 + -1);
          pdVar14 = pdVar18;
        } while (pdVar23 != (double *)0x0);
      }
    }
  }
  pVar26._9_7_ = (undefined7)((ulong)param_3 >> 8);
  pVar26.second = end <= pdVar1;
  *begin = pdVar18[-1];
  pdVar18[-1] = dVar4;
  pVar26.first._M_current = pdVar18 + -1;
  return pVar26;
}

Assistant:

inline std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;

        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));
        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        if (!already_partitioned) {
            std::iter_swap(first, last);
            ++first;

            // The following branchless partitioning is derived from "BlockQuicksort: How Branch
            // Mispredictions don’t affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
            // heavily micro-optimized.
            unsigned char offsets_l_storage[block_size + cacheline_size];
            unsigned char offsets_r_storage[block_size + cacheline_size];
            unsigned char* offsets_l = align_cacheline(offsets_l_storage);
            unsigned char* offsets_r = align_cacheline(offsets_r_storage);

            Iter offsets_l_base = first;
            Iter offsets_r_base = last;
            size_t num_l, num_r, start_l, start_r;
            num_l = num_r = start_l = start_r = 0;
            
            while (first < last) {
                // Fill up offset blocks with elements that are on the wrong side.
                // First we determine how much elements are considered for each offset block.
                size_t num_unknown = last - first;
                size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
                size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

                // Fill the offset blocks.
                if (left_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                } else {
                    for (size_t i = 0; i < left_split;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                }

                if (right_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                } else {
                    for (size_t i = 0; i < right_split;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                }

                // Swap elements and update block sizes and first/last boundaries.
                size_t num = std::min(num_l, num_r);
                swap_offsets(offsets_l_base, offsets_r_base,
                             offsets_l + start_l, offsets_r + start_r,
                             num, num_l == num_r);
                num_l -= num; num_r -= num;
                start_l += num; start_r += num;

                if (num_l == 0) {
                    start_l = 0;
                    offsets_l_base = first;
                }
                
                if (num_r == 0) {
                    start_r = 0;
                    offsets_r_base = last;
                }
            }

            // We have now fully identified [first, last)'s proper position. Swap the last elements.
            if (num_l) {
                offsets_l += start_l;
                while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
                first = last;
            }
            if (num_r) {
                offsets_r += start_r;
                while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
                last = first;
            }
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }